

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O1

void release_char_sheet_config(void)

{
  long lVar1;
  
  if (cached_config != (char_sheet_config *)0x0) {
    lVar1 = 0;
    do {
      mem_free(cached_config->resists_by_region[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
    mem_free(cached_config->stat_mod_entries);
    mem_free(cached_config);
    cached_config = (char_sheet_config *)0x0;
  }
  return;
}

Assistant:

static void release_char_sheet_config(void)
{
	int i;

	if (!cached_config) {
		return;
	}
	for (i = 0; i < 4; ++i) {
		mem_free(cached_config->resists_by_region[i]);
	}
	mem_free(cached_config->stat_mod_entries);
	mem_free(cached_config);
	cached_config = 0;
}